

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion_handler.hpp
# Opt level: O3

void asio::detail::
     completion_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>_>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  func_type p_Var1;
  handler_work<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>,_asio::system_executor>
  w;
  wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>
  handler;
  handler_work<asio::detail::wrapped_handler<asio::io_context::strand,std::function<void()>,asio::detail::is_continuation_if_running>,asio::system_executor>
  local_61;
  ptr local_60;
  wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>
  local_48;
  
  local_48.dispatcher_.service_ = (strand_service *)base[1].next_;
  local_48.dispatcher_.impl_ = (implementation_type)base[1].func_;
  local_48.handler_.super__Function_base._M_manager = (_Manager_type)0x0;
  local_48.handler_._M_invoker = *(_Invoker_type *)&base[2].task_result_;
  p_Var1 = base[2].func_;
  local_48.handler_.super__Function_base._M_functor = (_Any_data)(ZEXT816(0) << 0x20);
  if (p_Var1 != (func_type)0x0) {
    local_48.handler_.super__Function_base._M_functor = *(_Any_data *)&base[1].task_result_;
    *(undefined1 (*) [16])&base[2].func_ = ZEXT816(0) << 0x20;
    local_48.handler_.super__Function_base._M_manager = (_Manager_type)p_Var1;
  }
  local_60.h = &local_48;
  local_60.v = (completion_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>_>
                *)base;
  local_60.p = (completion_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>_>
                *)base;
  ptr::reset(&local_60);
  if (owner != (void *)0x0) {
    handler_work<asio::detail::wrapped_handler<asio::io_context::strand,std::function<void()>,asio::detail::is_continuation_if_running>,asio::system_executor>
    ::
    complete<asio::detail::wrapped_handler<asio::io_context::strand,std::function<void()>,asio::detail::is_continuation_if_running>>
              (&local_61,&local_48,&local_48);
  }
  if ((func_type)local_48.handler_.super__Function_base._M_manager != (func_type)0x0) {
    (*local_48.handler_.super__Function_base._M_manager)
              (&local_48.handler_,(scheduler_operation *)&local_48.handler_,(error_code *)0x3,
               param_4);
  }
  ptr::reset(&local_60);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    completion_handler* h(static_cast<completion_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };
    handler_work<Handler> w(h->handler_);

    ASIO_HANDLER_COMPLETION((*h));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(h->handler_));
    p.h = asio::detail::addressof(handler);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      w.complete(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }